

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

void __thiscall
cmCTestCVS::UpdateParser::UpdateParser(UpdateParser *this,cmCTestCVS *cvs,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_0095e428;
  this->CVS = cvs;
  (this->RegexFileUpdated).regmust = (char *)0x0;
  (this->RegexFileUpdated).program = (char *)0x0;
  (this->RegexFileUpdated).progsize = 0;
  memset(&this->RegexFileUpdated,0,0xaa);
  (this->RegexFileModified).regmust = (char *)0x0;
  (this->RegexFileModified).program = (char *)0x0;
  (this->RegexFileModified).progsize = 0;
  memset(&this->RegexFileModified,0,0xaa);
  (this->RegexFileConflicting).regmust = (char *)0x0;
  (this->RegexFileConflicting).program = (char *)0x0;
  (this->RegexFileConflicting).progsize = 0;
  memset(&this->RegexFileConflicting,0,0xaa);
  (this->RegexFileRemoved1).regmust = (char *)0x0;
  (this->RegexFileRemoved1).program = (char *)0x0;
  (this->RegexFileRemoved1).progsize = 0;
  memset(&this->RegexFileRemoved1,0,0xaa);
  (this->RegexFileRemoved2).regmust = (char *)0x0;
  (this->RegexFileRemoved2).program = (char *)0x0;
  (this->RegexFileRemoved2).progsize = 0;
  memset(&this->RegexFileRemoved2,0,0xaa);
  cmProcessTools::LineParser::SetLog(&this->super_LineParser,(cvs->super_cmCTestVC).Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexFileUpdated,"^([UP])  *(.*)");
  cmsys::RegularExpression::compile(&this->RegexFileModified,"^([MRA])  *(.*)");
  cmsys::RegularExpression::compile(&this->RegexFileConflicting,"^([C])  *(.*)");
  cmsys::RegularExpression::compile
            (&this->RegexFileRemoved1,
             "cvs[^ ]* update: `?([^\']*)\'? is no longer in the repository");
  cmsys::RegularExpression::compile
            (&this->RegexFileRemoved2,
             "cvs[^ ]* update: warning: `?([^\']*)\'? is not \\(any longer\\) pertinent");
  return;
}

Assistant:

UpdateParser(cmCTestCVS* cvs, const char* prefix)
    : CVS(cvs)
  {
    this->SetLog(&cvs->Log, prefix);
    // See "man cvs", section "update output".
    this->RegexFileUpdated.compile("^([UP])  *(.*)");
    this->RegexFileModified.compile("^([MRA])  *(.*)");
    this->RegexFileConflicting.compile("^([C])  *(.*)");
    this->RegexFileRemoved1.compile(
      "cvs[^ ]* update: `?([^']*)'? is no longer in the repository");
    this->RegexFileRemoved2.compile(
      "cvs[^ ]* update: "
      "warning: `?([^']*)'? is not \\(any longer\\) pertinent");
  }